

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

MessageType __thiscall
cmMakefile::ExpandVariablesInStringOld
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  long lVar7;
  cmValue cVar8;
  ostream *poVar9;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar10;
  _Alloc_hider s;
  string_view str;
  string local_278;
  RegularExpression *local_258;
  cmCommandArgumentParserHelper parser;
  string input;
  
  lVar7 = std::__cxx11::string::find_first_of((char *)source,0x5a6b0d);
  if (lVar7 == -1) {
    return LOG;
  }
  if (atOnly) {
    std::__cxx11::string::string((string *)&input,(string *)source);
    source->_M_string_length = 0;
    *(source->_M_dataplus)._M_p = '\0';
    local_258 = &this->cmAtVarRegex;
    s = input._M_dataplus;
    while (bVar4 = cmsys::RegularExpression::find(local_258,s._M_p), bVar4) {
      pcVar1 = (this->cmAtVarRegex).regmatch.searchstring;
      pcVar2 = (this->cmAtVarRegex).regmatch.startp[0];
      pcVar3 = (this->cmAtVarRegex).regmatch.endp[0];
      std::__cxx11::string::append((char *)source,(ulong)s._M_p);
      lVar7 = (long)pcVar3 - (long)pcVar1;
      parser.InputBufferPos = (size_type)&parser.InputSize;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&parser,s._M_p + (long)(pcVar2 + (1 - (long)pcVar1)),s._M_p + lVar7 + -1)
      ;
      cVar8 = GetDefinition(this,(string *)&parser);
      if (cVar8.Value != (string *)0x0) {
        if (escapeQuotes) {
          str._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
          str._M_len = (cVar8.Value)->_M_string_length;
          cmEscapeQuotes_abi_cxx11_(&local_278,str);
          std::__cxx11::string::append((string *)source);
          std::__cxx11::string::~string((string *)&local_278);
        }
        else {
          std::__cxx11::string::append((string *)source);
        }
      }
      s._M_p = s._M_p + lVar7;
      std::__cxx11::string::~string((string *)&parser);
    }
    std::__cxx11::string::append((char *)source);
    std::__cxx11::string::~string((string *)&input);
    return LOG;
  }
  cmCommandArgumentParserHelper::cmCommandArgumentParserHelper(&parser);
  cmCommandArgumentParserHelper::SetMakefile(&parser,this);
  cmCommandArgumentParserHelper::SetLineFile(&parser,line,filename);
  parser.ReplaceAtSyntax = replaceAt;
  parser.RemoveEmpty = removeEmpty;
  parser.EscapeQuotes = escapeQuotes;
  parser.NoEscapeMode = noEscapes;
  iVar5 = cmCommandArgumentParserHelper::ParseString(&parser,source,0);
  if ((iVar5 != 0) && (*parser.ErrorString._M_dataplus._M_p == '\0')) {
    std::__cxx11::string::_M_assign((string *)source);
    MVar10 = LOG;
    goto LAB_00351adb;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&input);
  std::operator<<((ostream *)&input,"Syntax error in cmake code ");
  if (0 < line && filename != (char *)0x0) {
    poVar9 = std::operator<<((ostream *)&input,"at\n");
    poVar9 = std::operator<<(poVar9,"  ");
    poVar9 = std::operator<<(poVar9,filename);
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::operator<<(poVar9,"\n");
  }
  poVar9 = std::operator<<((ostream *)&input,"when parsing string\n");
  poVar9 = std::operator<<(poVar9,"  ");
  poVar9 = std::operator<<(poVar9,(string *)source);
  std::operator<<(poVar9,"\n");
  std::operator<<((ostream *)&input,parser.ErrorString._M_dataplus._M_p);
  MVar10 = FATAL_ERROR;
  if (iVar5 == 0) {
    PVar6 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0010,false);
    if (PVar6 - REQUIRED_IF_USED < 2) {
      poVar9 = std::operator<<((ostream *)&input,"\n");
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_278,(cmPolicies *)0xa,id_00);
      std::operator<<(poVar9,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
    }
    else {
      if (PVar6 != OLD) {
        if (PVar6 != WARN) goto LAB_003519f7;
        poVar9 = std::operator<<((ostream *)&input,"\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_278,(cmPolicies *)0xa,id);
        std::operator<<(poVar9,(string *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
      }
      MVar10 = AUTHOR_WARNING;
    }
  }
LAB_003519f7:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&input);
LAB_00351adb:
  cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper(&parser);
  return MVar10;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringOld(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // Fast path strings without any special characters.
  if (source.find_first_of("$@\\") == std::string::npos) {
    return MessageType::LOG;
  }

  // Special-case the @ONLY mode.
  if (atOnly) {
    // Store an original copy of the input.
    std::string input = source;

    // Start with empty output.
    source.clear();

    // Look for one @VAR@ at a time.
    const char* in = input.c_str();
    while (this->cmAtVarRegex.find(in)) {
      // Get the range of the string to replace.
      const char* first = in + this->cmAtVarRegex.start();
      const char* last = in + this->cmAtVarRegex.end();

      // Store the unchanged part of the string now.
      source.append(in, first - in);

      // Lookup the definition of VAR.
      std::string var(first + 1, last - first - 2);
      if (cmValue val = this->GetDefinition(var)) {
        // Store the value in the output escaping as requested.
        if (escapeQuotes) {
          source.append(cmEscapeQuotes(*val));
        } else {
          source.append(*val);
        }
      }

      // Continue looking for @VAR@ further along the string.
      in = last;
    }

    // Append the rest of the unchanged part of the string.
    source.append(in);

    return MessageType::LOG;
  }

  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  cmCommandArgumentParserHelper parser;
  parser.SetMakefile(this);
  parser.SetLineFile(line, filename);
  parser.SetEscapeQuotes(escapeQuotes);
  parser.SetNoEscapeMode(noEscapes);
  parser.SetReplaceAtSyntax(replaceAt);
  parser.SetRemoveEmpty(removeEmpty);
  int res = parser.ParseString(source, 0);
  const char* emsg = parser.GetError();
  MessageType mtype = MessageType::LOG;
  if (res && !emsg[0]) {
    source = parser.GetResult();
  } else {
    // Construct the main error message.
    std::ostringstream error;
    error << "Syntax error in cmake code ";
    if (filename && line > 0) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      error << "at\n"
            << "  " << filename << ":" << line << "\n";
    }
    error << "when parsing string\n"
          << "  " << source << "\n";
    error << emsg;

    // If the parser failed ("res" is false) then this is a real
    // argument parsing error, so the policy applies.  Otherwise the
    // parser reported an error message without failing because the
    // helper implementation is unhappy, which has always reported an
    // error.
    mtype = MessageType::FATAL_ERROR;
    if (!res) {
      // This is a real argument parsing error.  Use policy CMP0010 to
      // decide whether it is an error.
      switch (this->GetPolicyStatus(cmPolicies::CMP0010)) {
        case cmPolicies::WARN:
          error << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0010);
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          // OLD behavior is to just warn and continue.
          mtype = MessageType::AUTHOR_WARNING;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          error << "\n"
                << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0010);
          break;
        case cmPolicies::NEW:
          // NEW behavior is to report the error.
          break;
      }
    }
    errorstr = error.str();
  }
  return mtype;
}